

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall ObjectModelBuilder::build(ObjectModelBuilder *this,value *value)

{
  bool bVar1;
  ostream *poVar2;
  object *this_00;
  reference ppVar3;
  string local_c0;
  undefined1 local_a0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  i;
  const_iterator __end1;
  const_iterator __begin1;
  object *__range1;
  object *object;
  bool ok;
  string local_40;
  value *local_20;
  value *value_local;
  ObjectModelBuilder *this_local;
  
  local_20 = value;
  value_local = (value *)this;
  bVar1 = picojson::value::
          is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                    (value);
  if (bVar1) {
    object._3_1_ = true;
    this_00 = picojson::value::
              get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                        (local_20);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
             ::begin(this_00);
    i.second.u_ = (_storage)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                  ::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&i.second.u_), bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
               ::operator*(&__end1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
              *)local_a0,ppVar3);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"class-declarations");
      if (bVar1) {
        object._3_1_ = buildClasses(this,(value *)((long)&i.first.field_2 + 8),true);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0,"classes");
        if (bVar1) {
          object._3_1_ = buildClasses(this,(value *)((long)&i.first.field_2 + 8),false);
        }
      }
      if (object._3_1_ == false) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"error: failed to build \'");
        poVar2 = std::operator<<(poVar2,(string *)local_a0);
        poVar2 = std::operator<<(poVar2,"\', ");
        picojson::value::to_str_abi_cxx11_(&local_c0,(value *)((long)&i.first.field_2 + 8));
        poVar2 = std::operator<<(poVar2,(string *)&local_c0);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
               *)local_a0);
      if (object._3_1_ == false) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: toplevel json element is not a value");
    picojson::value::to_str_abi_cxx11_(&local_40,local_20);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ObjectModelBuilder::build(const picojson::value &value)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: toplevel json element is not a value" << value.to_str() << std::endl;
        return false;
    }

    bool ok = true;
    const picojson::object &object = value.get<picojson::object>();
    for (auto i : object) {
        if (i.first == "class-declarations") {
            ok = buildClasses(i.second, true);
        } else if (i.first == "classes") {
            ok = buildClasses(i.second, false);
        }

        if (!ok) {
            std::cerr << "error: failed to build '" << i.first << "', " << i.second.to_str() << std::endl;
            break;
        }
    }

    return true;
}